

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<signed_char,char_const(&)[1]>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [1])

{
  char *value;
  char (*value_00) [1];
  CappedArray<char,_5UL> CVar1;
  CappedArray<char,_5UL> local_50;
  CappedArray<char,_5UL> local_40;
  size_t local_30;
  undefined4 local_28;
  char local_24;
  char (*local_20) [1];
  char (*params_local_1) [1];
  char *params_local;
  
  local_20 = (char (*) [1])params;
  params_local_1 = (char (*) [1])this;
  params_local = (char *)__return_storage_ptr__;
  value = fwd<signed_char>((NoInfer<signed_char> *)this);
  CVar1 = toCharSequence<signed_char>(value);
  local_40.currentSize = CVar1.currentSize;
  local_30 = local_40.currentSize;
  local_40.content._0_4_ = CVar1.content._0_4_;
  local_28._0_1_ = local_40.content[0];
  local_28._1_1_ = local_40.content[1];
  local_28._2_1_ = local_40.content[2];
  local_28._3_1_ = local_40.content[3];
  local_40.content[4] = CVar1.content[4];
  local_24 = local_40.content[4];
  local_40 = CVar1;
  value_00 = ::const(local_20);
  local_50 = (CappedArray<char,_5UL>)toCharSequence<char_const(&)[1]>(value_00);
  _::concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_50,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}